

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType
          (PathTypeHandlerBase *this,DynamicObject *instance,PathTypeSuccessorKey key,
          PropertyIndex *propertyIndex)

{
  int oldCount;
  int newCount;
  ScriptContext *scriptContext_00;
  DynamicType *pDVar1;
  DynamicTypeHandler *pDVar2;
  PathTypeHandlerBase *nextPath;
  DynamicType *nextType;
  DynamicType *currentType;
  ScriptContext *scriptContext;
  PropertyIndex *propertyIndex_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  PathTypeSuccessorKey key_local;
  
  scriptContext_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pDVar1 = DynamicObject::GetDynamicType(instance);
  pDVar1 = PromoteType<false>(this,pDVar1,key,false,scriptContext_00,instance,propertyIndex);
  pDVar2 = DynamicType::GetTypeHandler(pDVar1);
  oldCount = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  newCount = DynamicTypeHandler::GetSlotCapacity(pDVar2);
  pDVar2 = DynamicType::GetTypeHandler(pDVar1);
  DynamicObject::EnsureSlots(instance,oldCount,newCount,scriptContext_00,pDVar2);
  DynamicTypeHandler::ReplaceInstanceType(instance,pDVar1);
  return pDVar1;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicObject* instance, const PathTypeSuccessorKey key, PropertyIndex* propertyIndex)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DynamicType* currentType = instance->GetDynamicType();

        DynamicType* nextType = this->PromoteType<false>(currentType, key, false, scriptContext, instance, propertyIndex);
        PathTypeHandlerBase* nextPath = (PathTypeHandlerBase*) nextType->GetTypeHandler();

        instance->EnsureSlots(this->GetSlotCapacity(), nextPath->GetSlotCapacity(), scriptContext, nextType->GetTypeHandler());

        ReplaceInstanceType(instance, nextType);
        return nextType;
    }